

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_atomic(CompilerHLSL *this,uint32_t *ops,uint32_t length,Op op)

{
  undefined4 uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  CompilerError *pCVar5;
  SPIRType *pSVar6;
  mapped_type *ts_5;
  int32_t *ts_5_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4;
  string *ts_4_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar7;
  bool local_319;
  string local_318 [32];
  undefined1 local_2f8 [8];
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [36];
  uint32_t local_2b4;
  string local_2b0 [8];
  string base_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [32];
  undefined1 local_270 [44];
  BaseType expr_type;
  SPIRAccessChain *chain_1;
  SPIRType *data_type_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [32];
  SPIRType *local_1f8;
  SPIRType *type;
  char local_1e8;
  uint32_t local_1e0;
  uint32_t local_1dc;
  uint32_t id;
  uint32_t result_type;
  undefined1 local_1b8 [48];
  string base;
  undefined1 local_170 [32];
  undefined1 local_150 [32];
  undefined1 local_130 [40];
  mapped_type *tmp_id;
  SPIRAccessChain *chain;
  SPIRType *data_type;
  spirv_cross local_d8 [32];
  undefined1 local_b8 [67];
  byte local_75;
  bool is_atomic_store;
  undefined1 local_68 [40];
  string value_expr;
  char *local_28;
  char *atomic_op;
  Op op_local;
  uint32_t length_local;
  uint32_t *ops_local;
  CompilerHLSL *this_local;
  
  local_28 = (char *)0x0;
  atomic_op._0_4_ = op;
  atomic_op._4_4_ = length;
  _op_local = (TypedID<(spirv_cross::Types)0> *)ops;
  ops_local = (uint32_t *)this;
  ::std::__cxx11::string::string((string *)(local_68 + 0x20));
  uVar4 = (uint32_t)this;
  if (((((Op)atomic_op != OpAtomicIDecrement) && ((Op)atomic_op != OpAtomicIIncrement)) &&
      ((Op)atomic_op != OpAtomicLoad)) && ((Op)atomic_op != OpAtomicStore)) {
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_68,uVar4,
               SUB41(_op_local[(ulong)((Op)atomic_op == OpAtomicCompareExchange) + 5].id,0));
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),(string *)local_68);
    ::std::__cxx11::string::~string((string *)local_68);
  }
  local_75 = 0;
  switch((Op)atomic_op) {
  case OpAtomicLoad:
    local_28 = "InterlockedAdd";
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),"0");
    break;
  case OpAtomicStore:
    local_28 = "InterlockedExchange";
    local_75 = 1;
    break;
  case OpAtomicExchange:
    local_28 = "InterlockedExchange";
    break;
  case OpAtomicCompareExchange:
    if (atomic_op._4_4_ < 8) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Not enough data for opcode.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_28 = "InterlockedCompareExchange";
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)&data_type,uVar4,SUB41(_op_local[7].id,0));
    join<std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
              (local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &data_type,(char (*) [3])0x421228,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_68 + 0x20));
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),(string *)local_d8);
    ::std::__cxx11::string::~string((string *)local_d8);
    ::std::__cxx11::string::~string((string *)&data_type);
    break;
  default:
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar5,"Unknown atomic opcode.");
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case OpAtomicIIncrement:
    local_28 = "InterlockedAdd";
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),"1");
    break;
  case OpAtomicIDecrement:
    local_28 = "InterlockedAdd";
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),"-1");
    break;
  case OpAtomicIAdd:
    local_28 = "InterlockedAdd";
    break;
  case OpAtomicISub:
    local_28 = "InterlockedAdd";
    CompilerGLSL::enclose_expression((CompilerGLSL *)local_b8,(string *)this);
    join<char_const(&)[2],std::__cxx11::string>
              ((spirv_cross *)(local_b8 + 0x20),(char (*) [2])0x40a394,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    ::std::__cxx11::string::operator=((string *)(local_68 + 0x20),(string *)(local_b8 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_b8 + 0x20));
    ::std::__cxx11::string::~string((string *)local_b8);
    break;
  case OpAtomicSMin:
  case OpAtomicUMin:
    local_28 = "InterlockedMin";
    break;
  case OpAtomicSMax:
  case OpAtomicUMax:
    local_28 = "InterlockedMax";
    break;
  case OpAtomicAnd:
    local_28 = "InterlockedAnd";
    break;
  case OpAtomicOr:
    local_28 = "InterlockedOr";
    break;
  case OpAtomicXor:
    local_28 = "InterlockedXor";
  }
  if ((local_75 & 1) == 0) {
    local_1dc = _op_local->id;
    local_1e0 = _op_local[1].id;
    pVar7 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries,&_op_local[1].id)
    ;
    type = (SPIRType *)pVar7.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_1e8 = pVar7.second;
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_1dc);
    local_1f8 = pSVar6;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&data_type_1,this,(ulong)local_1e0,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
              (local_218,this,pSVar6,&data_type_1,0);
    CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,local_218,(char (*) [2])0x42463b);
    ::std::__cxx11::string::~string((string *)local_218);
    ::std::__cxx11::string::~string((string *)&data_type_1);
    chain_1 = (SPIRAccessChain *)Compiler::expression_type((Compiler *)this,_op_local[2].id);
    register0x00000000 =
         Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,_op_local[2].id);
    if ((*(int *)((chain_1->implied_read_expressions).stack_storage.aligned_char + 8) == 0xb) ||
       (register0x00000000 == (SPIRAccessChain *)0x0)) {
      CompilerGLSL::to_non_uniform_aware_expression_abi_cxx11_((CompilerGLSL *)local_270,uVar4);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (local_290,this,(ulong)local_1e0,1);
      CompilerGLSL::
      statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,&local_28,(char (*) [2])0x422b6e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                 (char (*) [3])0x421228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_68 + 0x20),(char (*) [3])0x421228,local_290,(char (*) [3])0x40acad);
      ::std::__cxx11::string::~string((string *)local_290);
      ::std::__cxx11::string::~string((string *)local_270);
      local_270._36_4_ = chain_1->storage;
    }
    else {
      ::std::__cxx11::string::string(local_2b0,(string *)&register0x00000000->base);
      local_2b4 = (stack0xfffffffffffffdb8->super_IVariant).self.id;
      bVar2 = Compiler::has_decoration((Compiler *)this,(ID)local_2b4,DecorationNonUniform);
      if (bVar2) {
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(stack0xfffffffffffffdb8->super_IVariant).self);
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,(string *)local_2b0,uVar4);
      }
      local_270._36_4_ = StorageClassGeneric;
      ts_4_00 = &stack0xfffffffffffffdb8->dynamic_index;
      ts_5_00 = &stack0xfffffffffffffdb8->static_index;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (local_2d8,this,(ulong)local_1e0,1);
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                 (char (*) [2])0x40b926,&local_28,(char (*) [2])0x422b6e,ts_4_00,ts_5_00,
                 (char (*) [3])0x421228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_68 + 0x20),(char (*) [3])0x421228,local_2d8,(char (*) [3])0x40acad);
      ::std::__cxx11::string::~string((string *)local_2d8);
      ::std::__cxx11::string::~string(local_2b0);
    }
    pSVar6 = local_1f8;
    uVar1 = local_270._36_4_;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_318,this,(ulong)local_1e0,1);
    CompilerGLSL::bitcast_expression
              ((CompilerGLSL *)local_2f8,(SPIRType *)this,(BaseType)pSVar6,
               (string *)(ulong)(uint)uVar1);
    ::std::__cxx11::string::~string(local_318);
    local_319 = true;
    Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string&,unsigned_int&,bool>
              ((Compiler *)this,local_1e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
               &local_1dc,&local_319);
    ::std::__cxx11::string::~string((string *)local_2f8);
  }
  else {
    chain = (SPIRAccessChain *)Compiler::expression_type((Compiler *)this,_op_local->id);
    tmp_id = (mapped_type *)
             Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,_op_local->id);
    local_130._32_8_ =
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::operator[](&(this->super_CompilerGLSL).extra_sub_expressions,&_op_local->id);
    if (*(mapped_type *)local_130._32_8_ == 0) {
      uVar3 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      *(uint32_t *)local_130._32_8_ = uVar3;
      pSVar6 = Compiler::get_pointee_type((Compiler *)this,(SPIRType *)chain);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,uVar3,*(uint32_t *)local_130._32_8_);
    }
    if ((*(int *)((chain->implied_read_expressions).stack_storage.aligned_char + 8) == 0xb) ||
       (tmp_id == (mapped_type *)0x0)) {
      CompilerGLSL::to_non_uniform_aware_expression_abi_cxx11_((CompilerGLSL *)local_130,uVar4);
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_150,uVar4,SUB41(_op_local[3].id,0));
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_170,uVar4,SUB41(*(uint32_t *)local_130._32_8_,0));
      CompilerGLSL::
      statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,&local_28,(char (*) [2])0x422b6e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                 (char (*) [3])0x421228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 (char (*) [3])0x421228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                 (char (*) [3])0x40acad);
      ::std::__cxx11::string::~string((string *)local_170);
      ::std::__cxx11::string::~string((string *)local_150);
      ::std::__cxx11::string::~string((string *)local_130);
    }
    else {
      ::std::__cxx11::string::string((string *)(local_1b8 + 0x28),(string *)(tmp_id + 6));
      local_1b8._36_4_ = tmp_id[2];
      bVar2 = Compiler::has_decoration((Compiler *)this,(ID)local_1b8._36_4_,DecorationNonUniform);
      if (bVar2) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)(tmp_id + 2));
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,(string *)(local_1b8 + 0x28),uVar3);
      }
      ts_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(tmp_id + 0xe);
      ts_5 = tmp_id + 0x16;
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_1b8,uVar4,SUB41(_op_local[3].id,0));
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)&id,uVar4,SUB41(*(uint32_t *)local_130._32_8_,0));
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1b8 + 0x28),(char (*) [2])0x40b926,&local_28,(char (*) [2])0x422b6e,ts_4,
                 (int *)ts_5,(char (*) [3])0x421228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 (char (*) [3])0x421228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,
                 (char (*) [3])0x40acad);
      ::std::__cxx11::string::~string((string *)&id);
      ::std::__cxx11::string::~string((string *)local_1b8);
      ::std::__cxx11::string::~string((string *)(local_1b8 + 0x28));
    }
  }
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  ::std::__cxx11::string::~string((string *)(local_68 + 0x20));
  return;
}

Assistant:

void CompilerHLSL::emit_atomic(const uint32_t *ops, uint32_t length, spv::Op op)
{
	const char *atomic_op = nullptr;

	string value_expr;
	if (op != OpAtomicIDecrement && op != OpAtomicIIncrement && op != OpAtomicLoad && op != OpAtomicStore)
		value_expr = to_expression(ops[op == OpAtomicCompareExchange ? 6 : 5]);

	bool is_atomic_store = false;

	switch (op)
	{
	case OpAtomicIIncrement:
		atomic_op = "InterlockedAdd";
		value_expr = "1";
		break;

	case OpAtomicIDecrement:
		atomic_op = "InterlockedAdd";
		value_expr = "-1";
		break;

	case OpAtomicLoad:
		atomic_op = "InterlockedAdd";
		value_expr = "0";
		break;

	case OpAtomicISub:
		atomic_op = "InterlockedAdd";
		value_expr = join("-", enclose_expression(value_expr));
		break;

	case OpAtomicSMin:
	case OpAtomicUMin:
		atomic_op = "InterlockedMin";
		break;

	case OpAtomicSMax:
	case OpAtomicUMax:
		atomic_op = "InterlockedMax";
		break;

	case OpAtomicAnd:
		atomic_op = "InterlockedAnd";
		break;

	case OpAtomicOr:
		atomic_op = "InterlockedOr";
		break;

	case OpAtomicXor:
		atomic_op = "InterlockedXor";
		break;

	case OpAtomicIAdd:
		atomic_op = "InterlockedAdd";
		break;

	case OpAtomicExchange:
		atomic_op = "InterlockedExchange";
		break;

	case OpAtomicStore:
		atomic_op = "InterlockedExchange";
		is_atomic_store = true;
		break;

	case OpAtomicCompareExchange:
		if (length < 8)
			SPIRV_CROSS_THROW("Not enough data for opcode.");
		atomic_op = "InterlockedCompareExchange";
		value_expr = join(to_expression(ops[7]), ", ", value_expr);
		break;

	default:
		SPIRV_CROSS_THROW("Unknown atomic opcode.");
	}

	if (is_atomic_store)
	{
		auto &data_type = expression_type(ops[0]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[0]);

		auto &tmp_id = extra_sub_expressions[ops[0]];
		if (!tmp_id)
		{
			tmp_id = ir.increase_bound_by(1);
			emit_uninitialized_temporary_expression(get_pointee_type(data_type).self, tmp_id);
		}

		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_non_uniform_aware_expression(ops[0]), ", ",
			          to_expression(ops[3]), ", ", to_expression(tmp_id), ");");
		}
		else
		{
			string base = chain->base;
			if (has_decoration(chain->self, DecorationNonUniform))
				convert_non_uniform_expression(base, chain->self);
			// RWByteAddress buffer is always uint in its underlying type.
			statement(base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ",
			          to_expression(ops[3]), ", ", to_expression(tmp_id), ");");
		}
	}
	else
	{
		uint32_t result_type = ops[0];
		uint32_t id = ops[1];
		forced_temporaries.insert(ops[1]);

		auto &type = get<SPIRType>(result_type);
		statement(variable_decl(type, to_name(id)), ";");

		auto &data_type = expression_type(ops[2]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[2]);
		SPIRType::BaseType expr_type;
		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_non_uniform_aware_expression(ops[2]), ", ", value_expr, ", ", to_name(id), ");");
			expr_type = data_type.basetype;
		}
		else
		{
			// RWByteAddress buffer is always uint in its underlying type.
			string base = chain->base;
			if (has_decoration(chain->self, DecorationNonUniform))
				convert_non_uniform_expression(base, chain->self);
			expr_type = SPIRType::UInt;
			statement(base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ", value_expr,
			          ", ", to_name(id), ");");
		}

		auto expr = bitcast_expression(type, expr_type, to_name(id));
		set<SPIRExpression>(id, expr, result_type, true);
	}
	flush_all_atomic_capable_variables();
}